

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::backwardJump(StackInterpreter *this,int delta)

{
  bool bVar1;
  int delta_local;
  StackInterpreter *this_local;
  
  this->pc = (long)delta + this->pc;
  fetchNextInstructionOpcode(this);
  bVar1 = garbageCollectionSafePoint(this);
  if (bVar1) {
    fetchFrameData(this);
  }
  return;
}

Assistant:

void backwardJump(int delta)
    {
        pc += delta;
        fetchNextInstructionOpcode();

        if(garbageCollectionSafePoint())
            fetchFrameData();
    }